

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O0

uint64_t dg::llvmutils::getAllocatedSize(AllocaInst *AI,DataLayout *DL)

{
  bool bVar1;
  ulong uVar2;
  AllocaInst *in_RDI;
  TypeSize TVar3;
  Type *Ty;
  Value *in_stack_ffffffffffffff78;
  SmallPtrSetImpl<llvm::Type_*> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint64_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  DataLayout *in_stack_ffffffffffffffb0;
  TypeSize local_30;
  Type *local_20;
  ulong local_8;
  
  local_20 = llvm::AllocaInst::getAllocatedType(in_RDI);
  bVar1 = llvm::Type::isSized((Type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff80);
  if (bVar1) {
    uVar2 = llvm::AllocaInst::isArrayAllocation();
    if ((uVar2 & 1) == 0) {
      llvm::DataLayout::getTypeAllocSize
                (in_stack_ffffffffffffffb0,
                 (Type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_8 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&stack0xffffffffffffff90)
      ;
    }
    else {
      llvm::AllocaInst::getArraySize((AllocaInst *)0x18e77d);
      getConstantSizeValue(in_stack_ffffffffffffff78);
      llvm::DataLayout::getTypeAllocSize
                (in_stack_ffffffffffffffb0,
                 (Type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      TVar3 = llvm::operator*(in_stack_ffffffffffffff90,
                              (TypeSize *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
      Value = TVar3.super_LinearPolySize<llvm::TypeSize>.
              super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
      local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
      UnivariateDim =
           TVar3.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
           .UnivariateDim;
      local_8 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_30);
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

inline uint64_t getAllocatedSize(const llvm::AllocaInst *AI,
                                 const llvm::DataLayout *DL) {
    llvm::Type *Ty = AI->getAllocatedType();
    if (!Ty->isSized())
        return 0;

    if (AI->isArrayAllocation()) {
        return getConstantSizeValue(AI->getArraySize()) *
               DL->getTypeAllocSize(Ty);
    }
    return DL->getTypeAllocSize(Ty);
}